

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

int __thiscall QTreeWidget::topLevelItemCount(QTreeWidget *this)

{
  int iVar1;
  QTreeWidgetPrivate *d;
  
  d_func((QTreeWidget *)0x9179e7);
  QTreeWidgetPrivate::treeModel((QTreeWidgetPrivate *)0x9179f6);
  iVar1 = QTreeWidgetItem::childCount((QTreeWidgetItem *)0x9179ff);
  return iVar1;
}

Assistant:

int QTreeWidget::topLevelItemCount() const
{
    Q_D(const QTreeWidget);
    return d->treeModel()->rootItem->childCount();
}